

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

int refine_cell(saucy *s,coloring *c,_func_int_saucy_ptr_coloring_ptr_int *refine)

{
  uint n;
  int *piVar1;
  int *piVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  
  if (1 < s->lev) {
    piVar1 = s->clist;
    n = s->csize;
    if ((long)(int)n < 2) {
      introsort_loop(piVar1,n,0);
    }
    else {
      iVar6 = 0;
      uVar5 = n;
      do {
        iVar6 = iVar6 + 2;
        bVar3 = 3 < uVar5;
        uVar5 = uVar5 >> 1;
      } while (bVar3);
      introsort_loop(piVar1,n,iVar6);
      if (1 < (int)n) {
        uVar4 = 1;
        do {
          iVar6 = piVar1[uVar4];
          uVar8 = uVar4 & 0xffffffff;
          do {
            iVar7 = (int)uVar8;
            if (piVar1[uVar8 - 1] <= iVar6) goto LAB_002a5823;
            piVar1[uVar8] = piVar1[uVar8 - 1];
            uVar8 = (ulong)(iVar7 - 1);
          } while (1 < iVar7);
          iVar7 = 0;
LAB_002a5823:
          piVar1[iVar7] = iVar6;
          uVar4 = uVar4 + 1;
        } while (uVar4 != (long)(int)n);
      }
    }
  }
  if (s->csize < 1) {
    iVar6 = 1;
  }
  else {
    lVar9 = 0;
    do {
      iVar6 = (*refine)(s,c,s->clist[lVar9]);
      if (iVar6 == 0) break;
      lVar9 = lVar9 + 1;
    } while (lVar9 < s->csize);
  }
  if (0 < s->csize) {
    piVar1 = s->clist;
    piVar2 = s->conncnts;
    lVar9 = 0;
    do {
      piVar2[piVar1[lVar9]] = 0;
      lVar9 = lVar9 + 1;
    } while (lVar9 < s->csize);
  }
  s->csize = 0;
  return iVar6;
}

Assistant:

static int
refine_cell(struct saucy *s, struct coloring *c,
    int (*refine)(struct saucy *, struct coloring *, int))
{
    int i, cf, ret = 1;

    /*
     * The connected list must be consistent.  This is for
     * detecting mappings across nodes at a given level.  However,
     * at the root of the tree, we never have to map with another
     * node, so we lack this consistency constraint in that case.
     */
    if (s->lev > 1) introsort(s->clist, s->csize);

    /* Now iterate over the marked cells */
    for (i = 0; ret && i < s->csize; ++i) {
        cf = s->clist[i];
        ret = refine(s, c, cf);
    }

    /* Clear the connected marks */
    for (i = 0; i < s->csize; ++i) {
        cf = s->clist[i];
        s->conncnts[cf] = 0;
    }
    s->csize = 0;
    return ret;
}